

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::type_is_bda_block_entry
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id)

{
  bool bVar1;
  SPIRType *type_00;
  SPIRType *type;
  uint32_t type_id_local;
  PhysicalStorageBufferPointerHandler *this_local;
  
  type_00 = get<spirv_cross::SPIRType>(this->compiler,type_id);
  bVar1 = is_physical_pointer(this->compiler,type_00);
  return bVar1;
}

Assistant:

bool Compiler::PhysicalStorageBufferPointerHandler::type_is_bda_block_entry(uint32_t type_id) const
{
	auto &type = compiler.get<SPIRType>(type_id);
	return compiler.is_physical_pointer(type);
}